

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O3

long intval(vm_val_t *val,long minval,long maxval,int pct,unsigned_long mask)

{
  uint uVar1;
  uint32_t uVar2;
  vm_datatype_t vVar3;
  int iVar4;
  int32_t iVar5;
  undefined8 in_RAX;
  ulong uVar6;
  int ov;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  vVar3 = val->typ;
  if (vVar3 == VM_NIL) {
    uVar6 = 0;
  }
  else if (vVar3 == VM_OBJ) {
    iVar4 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                   [(val->val).obj & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),
                       CVmObjBigNum::metaclass_reg_);
    if (iVar4 == 0) {
      vVar3 = val->typ;
      goto LAB_002a9d9b;
    }
    uVar1 = (val->val).obj & 0xfff;
    if (minval < 0) {
      iVar5 = CVmObjBigNum::ext_to_int
                        (*(char **)((long)&G_obj_table_X.pages_[(val->val).obj >> 0xc][uVar1].ptr_ +
                                   8),&local_34);
      uVar6 = (ulong)iVar5;
    }
    else {
      uVar2 = CVmObjBigNum::convert_to_uint
                        ((CVmObjBigNum *)(G_obj_table_X.pages_[(val->val).obj >> 0xc] + uVar1),
                         &local_34);
      uVar6 = (ulong)uVar2;
    }
    if ((pct == 0) && (local_34 != 0)) goto LAB_002a9def;
  }
  else if (vVar3 == VM_INT) {
    uVar6 = (ulong)(val->val).intval;
  }
  else {
LAB_002a9d9b:
    if (vVar3 == VM_INT) {
      iVar4 = (val->val).intval;
    }
    else {
      iVar4 = vm_val_t::nonint_cast_to_int(val);
    }
    uVar6 = (ulong)iVar4;
  }
  if (pct == 0) {
    if (((long)uVar6 < minval) || (maxval < (long)uVar6)) {
LAB_002a9def:
      err_throw(0x7e7);
    }
  }
  else {
    uVar6 = uVar6 & mask;
  }
  return uVar6;
}

Assistant:

static long intval(VMG_ const vm_val_t *val, long minval, long maxval,
                   int pct, unsigned long mask)
{
    /* get the value */
    long l;
    switch (val->typ)
    {
    case VM_NIL:
        /* use 0 for nil */
        l = 0;
        break;

    case VM_INT:
        /* regular integer */
        l = val->val.intval;
        break;

    case VM_OBJ:
        /* 
         *   convert BigNumber to integer explicitly; use the type cast for
         *   other types 
         */
        if (CVmObjBigNum::is_bignum_obj(vmg_ val->val.obj))
        {
            /* explicitly cast the BigNumber so that we can catch overflows */
            int ov;
            if (minval < 0)
            {
                l = ((CVmObjBigNum *)vm_objp(vmg_ val->val.obj))
                    ->convert_to_int(ov);
            }
            else
            {
                l = (long)((CVmObjBigNum *)vm_objp(vmg_ val->val.obj))
                    ->convert_to_uint(ov);
            }

            /* check for overflow */
            if (ov && !pct)
                err_throw(VMERR_NUM_OVERFLOW);;

            /* done */
            break;
        }
        /* FALL THROUGH to default */

    default:
        /* use the generic type cast */
        l = val->cast_to_int(vmg0_);
        break;
    }